

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O1

bool __thiscall helics::TimeCoordinator::addDependency(TimeCoordinator *this,GlobalFederateId fedID)

{
  iterator __position;
  bool bVar1;
  GlobalFederateId local_34;
  vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>> *local_30;
  unique_lock<std::mutex> local_28;
  
  local_34.gid = fedID.gid;
  bVar1 = BaseTimeCoordinator::addDependency(&this->super_BaseTimeCoordinator,fedID);
  if (bVar1) {
    local_30 = (vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>> *)
               &this->dependency_federates;
    local_28._M_device = &(this->dependency_federates).m_mutex;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    __position._M_current = *(GlobalFederateId **)(local_30 + 8);
    if (__position._M_current == *(GlobalFederateId **)(local_30 + 0x10)) {
      std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>::
      _M_realloc_insert<helics::GlobalFederateId_const&>(local_30,__position,&local_34);
    }
    else {
      (__position._M_current)->gid = local_34.gid;
      *(GlobalFederateId **)(local_30 + 8) = __position._M_current + 1;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
  }
  return bVar1;
}

Assistant:

bool TimeCoordinator::addDependency(GlobalFederateId fedID)
{
    if (BaseTimeCoordinator::addDependency(fedID)) {
        dependency_federates.lock()->push_back(fedID);
        return true;
    }
    return false;
}